

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O2

TeamType RenX::getTeam(int teamNum)

{
  if (1 < (uint)teamNum) {
    if (teamNum == 0xff) {
      return None;
    }
    teamNum = Other;
  }
  return teamNum;
}

Assistant:

RenX::TeamType RenX::getTeam(int teamNum)
{
	switch (teamNum)
	{
	case 0:
		return RenX::TeamType::GDI;
	case 1:
		return RenX::TeamType::Nod;
	case 255:
		return RenX::TeamType::None;
	default:
		return RenX::TeamType::Other;
	}
}